

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O3

void __thiscall QSqlResult::QSqlResult(QSqlResult *this,QSqlResultPrivate *dd)

{
  Data *pDVar1;
  QObject *this_00;
  NumericalPrecisionPolicy NVar2;
  
  this->_vptr_QSqlResult = (_func_int **)&PTR__QSqlResult_0014f4e8;
  this->d_ptr = dd;
  pDVar1 = (dd->sqldriver).wp.d;
  if ((pDVar1 != (Data *)0x0) &&
     (this_00 = (dd->sqldriver).wp.value,
     this_00 != (QObject *)0x0 && (pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
  {
    NVar2 = QSqlDriver::numericalPrecisionPolicy((QSqlDriver *)this_00);
    (*this->_vptr_QSqlResult[0x1d])(this,(ulong)NVar2);
    return;
  }
  return;
}

Assistant:

QSqlResult::QSqlResult(QSqlResultPrivate &dd)
    : d_ptr(&dd)
{
    Q_D(QSqlResult);
    if (d->sqldriver)
        setNumericalPrecisionPolicy(d->sqldriver->numericalPrecisionPolicy());
}